

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::setStandardOutputFile(QProcess *this,QString *fileName,OpenMode mode)

{
  QObjectData *pQVar1;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  QProcessPrivate::Channel::operator=((Channel *)&pQVar1[5].field_0x30,fileName);
  *(bool *)((long)&pQVar1[6].parent + 2) =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i ==
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)0x4;
  return;
}

Assistant:

void QProcess::setStandardOutputFile(const QString &fileName, OpenMode mode)
{
    Q_ASSERT(mode == Append || mode == Truncate);
    Q_D(QProcess);

    d->stdoutChannel = fileName;
    d->stdoutChannel.append = mode == Append;
}